

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkAttachBottom(Abc_Ntk_t *pNtkTop,Abc_Ntk_t *pNtkBottom)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  int iVar4;
  Abc_Obj_t *pNodeTo;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  if (pNtkBottom == (Abc_Ntk_t *)0x0) {
    __assert_fail("pNtkBottom != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x330,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkTop != (Abc_Ntk_t *)0x0) {
    pVVar6 = pNtkTop->vPis;
    uVar1 = pVVar6->nSize;
    uVar11 = (ulong)uVar1;
    if (uVar1 != pNtkTop->vCis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkTop) == Abc_NtkCiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x334,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    pVVar5 = pNtkBottom->vPis;
    iVar4 = pVVar5->nSize;
    if (iVar4 != pNtkBottom->vCis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) == Abc_NtkCiNum(pNtkBottom)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x335,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtkBottom->vPos->nSize != uVar1) {
      __assert_fail("Abc_NtkPoNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x337,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if ((int)uVar1 <= iVar4) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) < Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x338,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (0 < (int)uVar1) {
      lVar9 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar9];
        pNodeTo = Abc_NtkCreateNodeBuf(pNtkTop,(Abc_Obj_t *)0x0);
        Abc_ObjTransferFanout(pAVar2,pNodeTo);
        if (pNtkBottom->vPos->nSize <= lVar9) goto LAB_001ed0a9;
        *(Abc_Obj_t **)((long)pNtkBottom->vPos->pArray[lVar9] + 0x40) = pNodeTo;
        lVar9 = lVar9 + 1;
        pVVar6 = pNtkTop->vPis;
        uVar11 = (ulong)pVVar6->nSize;
      } while (lVar9 < (long)uVar11);
      pVVar5 = pNtkBottom->vPis;
      iVar4 = pVVar5->nSize;
    }
    if (iVar4 < (int)uVar11) {
      uVar8 = uVar11 & 0xffffffff;
      do {
        uVar8 = uVar8 - 1;
        iVar10 = (int)uVar11;
        if ((iVar10 < 1) || (pNtkTop->vPis->nSize < iVar10)) goto LAB_001ed0a9;
        Abc_NtkDeleteObj((Abc_Obj_t *)pNtkTop->vPis->pArray[uVar8 & 0xffffffff]);
        pVVar5 = pNtkBottom->vPis;
        iVar4 = pVVar5->nSize;
        uVar11 = (ulong)(iVar10 - 1U);
      } while (iVar4 < (int)(iVar10 - 1U));
      pVVar6 = pNtkTop->vPis;
    }
    if (iVar4 != pVVar6->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x343,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        if (pNtkTop->vPis->nSize <= lVar9) {
LAB_001ed0a9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(void **)((long)pVVar5->pArray[lVar9] + 0x40) = pNtkTop->vPis->pArray[lVar9];
        lVar9 = lVar9 + 1;
        pVVar5 = pNtkBottom->vPis;
      } while (lVar9 < pVVar5->nSize);
    }
    pVVar6 = Abc_NtkDfs(pNtkBottom,0);
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar9];
        Abc_NtkDupObj(pNtkTop,pAVar2,0);
        if (0 < (pAVar2->vFanins).nSize) {
          lVar7 = 0;
          do {
            Abc_ObjAddFanin((pAVar2->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar7]] +
                             0x40));
            lVar7 = lVar7 + 1;
          } while (lVar7 < (pAVar2->vFanins).nSize);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar6->nSize);
    }
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
    pVVar6 = pNtkBottom->vPos;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        plVar3 = (long *)pVVar6->pArray[lVar9];
        Abc_ObjAddFanin((Abc_Obj_t *)plVar3[8],
                        *(Abc_Obj_t **)
                         (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                   (long)*(int *)plVar3[4] * 8) + 0x40));
        lVar9 = lVar9 + 1;
        pVVar6 = pNtkBottom->vPos;
      } while (lVar9 < pVVar6->nSize);
    }
    Abc_NtkDelete(pNtkBottom);
    iVar4 = Abc_NtkCheck(pNtkTop);
    pNtkBottom = pNtkTop;
    if (iVar4 == 0) {
      fwrite("Abc_NtkAttachBottom(): Network check has failed.\n",0x31,1,_stdout);
    }
  }
  return pNtkBottom;
}

Assistant:

Abc_Ntk_t * Abc_NtkAttachBottom( Abc_Ntk_t * pNtkTop, Abc_Ntk_t * pNtkBottom )
{
    Abc_Obj_t * pObj, * pFanin, * pBuffer;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( pNtkBottom != NULL );
    if ( pNtkTop == NULL )
        return pNtkBottom;
    // make sure the networks are combinational
    assert( Abc_NtkPiNum(pNtkTop) == Abc_NtkCiNum(pNtkTop) );
    assert( Abc_NtkPiNum(pNtkBottom) == Abc_NtkCiNum(pNtkBottom) );
    // make sure the POs of the bottom correspond to the PIs of the top
    assert( Abc_NtkPoNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop) );
    assert( Abc_NtkPiNum(pNtkBottom) <  Abc_NtkPiNum(pNtkTop) );
    // add buffers for the PIs of the top - save results in the POs of the bottom
    Abc_NtkForEachPi( pNtkTop, pObj, i )
    {
        pBuffer = Abc_NtkCreateNodeBuf( pNtkTop, NULL );
        Abc_ObjTransferFanout( pObj, pBuffer );
        Abc_NtkPo(pNtkBottom, i)->pCopy = pBuffer;
    }
    // remove useless PIs of the top
    for ( i = Abc_NtkPiNum(pNtkTop) - 1; i >= Abc_NtkPiNum(pNtkBottom); i-- )
        Abc_NtkDeleteObj( Abc_NtkPi(pNtkTop, i) );
    assert( Abc_NtkPiNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop) );
    // copy the bottom network
    Abc_NtkForEachPi( pNtkBottom, pObj, i )
        Abc_NtkPi(pNtkBottom, i)->pCopy = Abc_NtkPi(pNtkTop, i);
    // construct all nodes
    vNodes = Abc_NtkDfs( pNtkBottom, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj(pNtkTop, pObj, 0);
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // connect the POs
    Abc_NtkForEachPo( pNtkBottom, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pObj)->pCopy );
    // delete old network
    Abc_NtkDelete( pNtkBottom );
    // return the network
    if ( !Abc_NtkCheck( pNtkTop ) )
        fprintf( stdout, "Abc_NtkAttachBottom(): Network check has failed.\n" );
    return pNtkTop;
}